

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkdatagram_p.h
# Opt level: O0

void __thiscall QIpPacketHeader::clear(QIpPacketHeader *this)

{
  QHostAddress *in_RDI;
  
  QHostAddress::clear(in_RDI);
  QHostAddress::clear(in_RDI);
  *(undefined4 *)&in_RDI[2].d.d.ptr = 0;
  *(undefined4 *)((long)&in_RDI[2].d.d.ptr + 4) = 0xffffffff;
  *(undefined4 *)&in_RDI[3].d.d.ptr = 0xffffffff;
  *(undefined1 *)&in_RDI[4].d.d.ptr = 0;
  return;
}

Assistant:

void clear()
    {
        senderAddress.clear();
        destinationAddress.clear();
        ifindex = 0;
        hopLimit = -1;
        streamNumber = -1;
        endOfRecord = false;
    }